

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O1

void map_fun(void *args,size_t size)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  undefined8 uVar4;
  
  pvVar3 = await(*(future_t **)((long)args + 8));
  uVar4 = (**(code **)((long)args + 0x10))
                    (pvVar3,*(undefined8 *)(*(long *)((long)args + 8) + 0x10),
                     *(long *)((long)args + 8) + 0x10);
  lVar1 = *args;
  *(undefined8 *)(lVar1 + 8) = uVar4;
  *(undefined1 *)(lVar1 + 0x18) = 0;
  iVar2 = sem_post((sem_t *)(lVar1 + 0x20));
  if (iVar2 == 0) {
    free(args);
    return;
  }
  exit(-4);
}

Assistant:

void map_fun(void *args, size_t size __attribute__((unused))) {
    data_t *my_data = args;

    void *temp_res = await(my_data->from);
    size_t temp_size = my_data->from->result_size;

    my_data->to->result = (my_data->function)(temp_res, temp_size, &(my_data->from->result_size));
    my_data->to->status = ready;

    if (sem_post(&(my_data->to->mutex))) {
        exit(semaphore_error);
    }
    free(my_data);
}